

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3RenameMethod(sqlite3_vtab *pVtab,char *zName)

{
  sqlite3 *db;
  long in_FS_OFFSET;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  db = (sqlite3 *)pVtab[1].pModule;
  local_2c = fts3SetHasStat((Fts3Table *)pVtab);
  if (local_2c == 0) {
    local_2c = sqlite3Fts3PendingTermsFlush((Fts3Table *)pVtab);
  }
  *(undefined1 *)&pVtab[0x13].nRef = 1;
  if (*(long *)&pVtab[3].nRef == 0) {
    fts3DbExec(&local_2c,db,"ALTER TABLE %Q.\'%q_content\'  RENAME TO \'%q_content\';",
               *(undefined8 *)&pVtab[1].nRef,pVtab[1].zErrMsg,zName);
  }
  if (*(char *)((long)&pVtab[0x13].pModule + 6) != '\0') {
    fts3DbExec(&local_2c,db,"ALTER TABLE %Q.\'%q_docsize\'  RENAME TO \'%q_docsize\';",
               *(undefined8 *)&pVtab[1].nRef,pVtab[1].zErrMsg,zName);
  }
  if (*(char *)((long)&pVtab[0x13].pModule + 5) != '\0') {
    fts3DbExec(&local_2c,db,"ALTER TABLE %Q.\'%q_stat\'  RENAME TO \'%q_stat\';",
               *(undefined8 *)&pVtab[1].nRef,pVtab[1].zErrMsg,zName);
  }
  fts3DbExec(&local_2c,db,"ALTER TABLE %Q.\'%q_segments\' RENAME TO \'%q_segments\';",
             *(undefined8 *)&pVtab[1].nRef,pVtab[1].zErrMsg,zName);
  fts3DbExec(&local_2c,db,"ALTER TABLE %Q.\'%q_segdir\'   RENAME TO \'%q_segdir\';",
             *(undefined8 *)&pVtab[1].nRef,pVtab[1].zErrMsg,zName);
  *(undefined1 *)&pVtab[0x13].nRef = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3RenameMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  const char *zName               /* New name of table */
){
  Fts3Table *p = (Fts3Table *)pVtab;
  sqlite3 *db = p->db;            /* Database connection */
  int rc;                         /* Return Code */

  /* At this point it must be known if the %_stat table exists or not.
  ** So bHasStat may not be 2.  */
  rc = fts3SetHasStat(p);

  /* As it happens, the pending terms table is always empty here. This is
  ** because an "ALTER TABLE RENAME TABLE" statement inside a transaction
  ** always opens a savepoint transaction. And the xSavepoint() method
  ** flushes the pending terms table. But leave the (no-op) call to
  ** PendingTermsFlush() in in case that changes.
  */
  assert( p->nPendingData==0 );
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts3PendingTermsFlush(p);
  }

  p->bIgnoreSavepoint = 1;

  if( p->zContentTbl==0 ){
    fts3DbExec(&rc, db,
      "ALTER TABLE %Q.'%q_content'  RENAME TO '%q_content';",
      p->zDb, p->zName, zName
    );
  }

  if( p->bHasDocsize ){
    fts3DbExec(&rc, db,
      "ALTER TABLE %Q.'%q_docsize'  RENAME TO '%q_docsize';",
      p->zDb, p->zName, zName
    );
  }
  if( p->bHasStat ){
    fts3DbExec(&rc, db,
      "ALTER TABLE %Q.'%q_stat'  RENAME TO '%q_stat';",
      p->zDb, p->zName, zName
    );
  }
  fts3DbExec(&rc, db,
    "ALTER TABLE %Q.'%q_segments' RENAME TO '%q_segments';",
    p->zDb, p->zName, zName
  );
  fts3DbExec(&rc, db,
    "ALTER TABLE %Q.'%q_segdir'   RENAME TO '%q_segdir';",
    p->zDb, p->zName, zName
  );

  p->bIgnoreSavepoint = 0;
  return rc;
}